

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::CreateOutputMaterials(SMDImporter *this)

{
  uint uVar1;
  pointer pbVar2;
  aiMaterial **ppaVar3;
  aiMaterial *paVar4;
  aiScene *paVar5;
  long lVar6;
  ulong uVar7;
  int iMode;
  aiString szName;
  undefined4 local_444;
  char local_440 [12];
  aiString local_434;
  
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x25a,"void Assimp::SMDImporter::CreateOutputMaterials()");
  }
  this->pScene->mNumMaterials =
       (uint)((ulong)((long)(this->aszTextures).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->aszTextures).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  paVar5 = this->pScene;
  uVar1 = paVar5->mNumMaterials;
  ppaVar3 = (aiMaterial **)operator_new__((ulong)(uVar1 + (uVar1 == 0)) << 3);
  paVar5->mMaterials = ppaVar3;
  paVar5 = this->pScene;
  if (paVar5->mNumMaterials != 0) {
    lVar6 = 8;
    uVar7 = 0;
    do {
      paVar4 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar4);
      this->pScene->mMaterials[uVar7] = paVar4;
      local_434.length = 0;
      local_434.data[0] = '\0';
      memset(local_434.data + 1,0x1b,0x3ff);
      local_434.length = snprintf(local_434.data,0x400,"Texture_%u");
      aiMaterial::AddProperty(paVar4,&local_434,"?mat.name",0,0);
      pbVar2 = (this->aszTextures).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar6) != 0) {
        strncpy(local_434.data,*(char **)((long)pbVar2 + lVar6 + -8),0x3ff);
        local_434.length = *(ai_uint32 *)((long)&(pbVar2->_M_dataplus)._M_p + lVar6);
        aiMaterial::AddProperty(paVar4,&local_434,"$tex.file",1,0);
      }
      uVar7 = uVar7 + 1;
      paVar5 = this->pScene;
      lVar6 = lVar6 + 0x20;
    } while (uVar7 < paVar5->mNumMaterials);
    if (paVar5->mNumMaterials != 0) {
      return;
    }
  }
  paVar5->mNumMaterials = 1;
  paVar4 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar4);
  *this->pScene->mMaterials = paVar4;
  local_444 = 2;
  aiMaterial::AddBinaryProperty(paVar4,&local_444,4,"$mat.shadingm",0,0,aiPTI_Integer);
  builtin_strncpy(local_440,"333?333?333?",0xc);
  aiMaterial::AddBinaryProperty(paVar4,local_440,0xc,"$clr.diffuse",0,0,aiPTI_Float);
  aiMaterial::AddBinaryProperty(paVar4,local_440,0xc,"$clr.specular",0,0,aiPTI_Float);
  local_440[0] = -0x33;
  local_440[1] = -0x34;
  local_440[2] = 'L';
  local_440[3] = '=';
  local_440[4] = -0x33;
  local_440[5] = -0x34;
  local_440[6] = 'L';
  local_440[7] = '=';
  local_440[8] = -0x33;
  local_440[9] = -0x34;
  local_440[10] = 'L';
  local_440[0xb] = '=';
  aiMaterial::AddBinaryProperty(paVar4,local_440,0xc,"$clr.ambient",0,0,aiPTI_Float);
  memset(local_434.data + 0x10,0x1b,0x3f0);
  local_434.length = 0xf;
  builtin_strncpy(local_434.data,"DefaultMaterial",0x10);
  aiMaterial::AddProperty(paVar4,&local_434,"?mat.name",0,0);
  return;
}

Assistant:

void SMDImporter::CreateOutputMaterials() {
    ai_assert( nullptr != pScene );

    pScene->mNumMaterials = (unsigned int)aszTextures.size();
    pScene->mMaterials = new aiMaterial*[std::max(1u, pScene->mNumMaterials)];

    for (unsigned int iMat = 0; iMat < pScene->mNumMaterials; ++iMat) {
        aiMaterial* pcMat = new aiMaterial();
        ai_assert( nullptr != pcMat );
        pScene->mMaterials[iMat] = pcMat;

        aiString szName;
        szName.length = (size_t)ai_snprintf(szName.data,MAXLEN,"Texture_%u",iMat);
        pcMat->AddProperty(&szName,AI_MATKEY_NAME);

        if (aszTextures[iMat].length())
        {
            ::strncpy(szName.data, aszTextures[iMat].c_str(),MAXLEN-1);
            szName.length = aszTextures[iMat].length();
            pcMat->AddProperty(&szName,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    // create a default material if necessary
    if (0 == pScene->mNumMaterials) {
        pScene->mNumMaterials = 1;

        aiMaterial* pcHelper = new aiMaterial();
        pScene->mMaterials[0] = pcHelper;

        int iMode = static_cast<int>(aiShadingMode_Gouraud);
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.7f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);
    }
}